

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O3

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  Type TVar1;
  undefined8 *puVar2;
  HandlerSym *handlerSym;
  IRBuiltinFunction *callee;
  int iVar3;
  int extraout_EAX;
  Instr *pIVar4;
  Instr *extraout_RAX;
  Instr *extraout_RAX_00;
  undefined4 in_register_00000034;
  long lVar5;
  unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *arg;
  undefined8 *puVar6;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> args;
  Value *v;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> local_68;
  undefined1 local_50 [32];
  
  lVar5 = CONCAT44(in_register_00000034,__fd);
  local_68.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (Value **)0x0;
  local_68.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Value **)0x0;
  puVar6 = *(undefined8 **)(lVar5 + 0x68);
  puVar2 = *(undefined8 **)(lVar5 + 0x70);
  if (puVar6 != puVar2) {
    do {
      (**(code **)(*(long *)*puVar6 + 0x10))((long *)*puVar6,this);
      pIVar4 = (Instr *)this->result_;
      local_50._0_8_ = pIVar4;
      if (pIVar4 == (Instr *)0x0) goto LAB_00112519;
      if (local_68.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_68.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<flow::Value*,std::allocator<flow::Value*>>::
        _M_realloc_insert<flow::Value*const&>
                  ((vector<flow::Value*,std::allocator<flow::Value*>> *)&local_68,
                   (iterator)
                   local_68.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(Value **)local_50);
      }
      else {
        *local_68.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
         super__Vector_impl_data._M_finish = (Value *)pIVar4;
        local_68.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_68.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar2);
  }
  handlerSym = *(HandlerSym **)(lVar5 + 0x40);
  TVar1 = (handlerSym->super_CallableSym).super_Symbol.type_;
  if (TVar1 == BuiltinFunction) {
    (*(handlerSym->super_CallableSym).super_Symbol.super_ASTNode._vptr_ASTNode[2])(handlerSym,this);
    callee = (IRBuiltinFunction *)this->result_;
    local_50._0_8_ = (Instr *)(local_50 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
    pIVar4 = IRBuilder::createCallFunction
                       (&this->super_IRBuilder,callee,&local_68,(string *)local_50);
    this->result_ = &pIVar4->super_Value;
    if ((Instr *)local_50._0_8_ != (Instr *)(local_50 + 0x10)) {
      operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
      pIVar4 = extraout_RAX;
    }
  }
  else if (TVar1 - BuiltinFunction < 2) {
    (*(handlerSym->super_CallableSym).super_Symbol.super_ASTNode._vptr_ASTNode[2])(handlerSym,this);
    pIVar4 = IRBuilder::createInvokeHandler
                       (&this->super_IRBuilder,(IRBuiltinHandler *)this->result_,&local_68);
    this->result_ = &pIVar4->super_Value;
  }
  else {
    codegenInline(this,handlerSym);
    this->result_ = (Value *)0x0;
    pIVar4 = extraout_RAX_00;
  }
LAB_00112519:
  iVar3 = (int)pIVar4;
  if (local_68.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar3 = extraout_EAX;
  }
  return iVar3;
}

Assistant:

void IRGenerator::accept(CallExpr& call) {
  std::vector<Value*> args;
  for (const std::unique_ptr<Expr>& arg : call.args().values()) {
    if (Value* v = codegen(arg.get())) {
      args.push_back(v);
    } else {
      return;
    }
  }

  if (call.callee()->isFunction()) {
    Value* callee = codegen(call.callee());
    // builtin function
    result_ = createCallFunction(static_cast<IRBuiltinFunction*>(callee), args);
  } else if (call.callee()->isBuiltin()) {
    Value* callee = codegen(call.callee());
    // builtin handler
    result_ = createInvokeHandler(static_cast<IRBuiltinHandler*>(callee), args);
  } else {
    // source handler
    codegenInline(*static_cast<HandlerSym*>(call.callee()));
    result_ = nullptr;
  }
}